

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O0

helix_session_t
helix_session_create(helix_protocol_t proto,helix_event_callback_t callback,void *data)

{
  int iVar1;
  protocol *ppVar2;
  undefined4 extraout_var;
  helix_session_t phVar4;
  undefined8 in_RDX;
  helix_protocol_t in_RDI;
  session *session;
  anon_class_16_2_bb9fc7e6 *__f;
  function<void_(const_helix::event_&)> *in_stack_ffffffffffffffa0;
  anon_class_16_2_bb9fc7e6 local_40 [2];
  session *local_20;
  undefined8 local_18;
  session *psVar3;
  
  local_18 = in_RDX;
  ppVar2 = unwrap(in_RDI);
  iVar1 = (*ppVar2->_vptr_protocol[2])(ppVar2,local_18);
  psVar3 = (session *)CONCAT44(extraout_var,iVar1);
  __f = local_40;
  local_20 = psVar3;
  std::function<void(helix::event_const&)>::function<helix_session_create::__0,void>
            (in_stack_ffffffffffffffa0,__f);
  (*psVar3->_vptr_session[4])(psVar3,__f);
  std::function<void_(const_helix::event_&)>::~function
            ((function<void_(const_helix::event_&)> *)0x1355af);
  phVar4 = wrap(local_20);
  return phVar4;
}

Assistant:

helix_session_t
helix_session_create(helix_protocol_t proto, helix_event_callback_t callback, void *data)
{
    auto session = unwrap(proto)->new_session(data);
    session->register_callback([session, callback](const helix::event& event) {
        callback(wrap(session), wrap(const_cast<helix::event*>(&event)));
    });
    return wrap(session);
}